

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int act_diff_hdrs(nt_opts *opts)

{
  char **ppcVar1;
  uint uVar2;
  nifti_1_header *s0;
  nifti_1_header *s1;
  
  if ((opts->infiles).len == 2) {
    if (2 < g_debug) {
      fprintf(_stderr,"-d nifti_1_header diff between %s and %s...\n",*(opts->infiles).list);
    }
    s0 = nt_read_header(opts,*(opts->infiles).list,(int *)0x0,0);
    uVar2 = 1;
    if (s0 != (nifti_1_header *)0x0) {
      s1 = nt_read_header(opts,(opts->infiles).list[1],(int *)0x0,0);
      if (s1 == (nifti_1_header *)0x0) {
        free(s0);
      }
      else {
        if (1 < g_debug) {
          ppcVar1 = (opts->infiles).list;
          fprintf(_stderr,"\n-d nifti_1_header diffs between \'%s\' and \'%s\'...\n",*ppcVar1,
                  ppcVar1[1]);
        }
        if ((opts->flist).len < 1) {
          uVar2 = diff_hdrs(s0,s1,(uint)(0 < g_debug));
        }
        else {
          uVar2 = diff_hdrs_list(s0,s1,&opts->flist,(uint)(0 < g_debug));
        }
        if (g_debug < 2 || uVar2 != 0) {
          if (2 < g_debug) {
            fprintf(_stderr,"+d %d differences found\n",(ulong)uVar2);
          }
        }
        else {
          fwrite("+d no differences found\n",0x18,1,_stderr);
        }
        free(s0);
        free(s1);
        uVar2 = (uint)(0 < (int)uVar2);
      }
    }
  }
  else {
    fprintf(_stderr,"** -diff_hdr requires 2 -infiles, have %d\n");
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int act_diff_hdrs( nt_opts * opts )
{
   nifti_1_header * nhdr0, * nhdr1;
   int              diffs = 0;

   if( opts->infiles.len != 2 ){
      fprintf(stderr,"** -diff_hdr requires 2 -infiles, have %d\n",
              opts->infiles.len);
      return 1;
   }

   if( g_debug > 2 )
      fprintf(stderr,"-d nifti_1_header diff between %s and %s...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   /* get the nifiti headers (but do not validate them) */

   nhdr0 = nt_read_header(opts, opts->infiles.list[0], NULL, 0);
   if( ! nhdr0 ) return 1;  /* errors have been printed */

   nhdr1 = nt_read_header(opts, opts->infiles.list[1], NULL, 0);
   if( ! nhdr1 ){ free(nhdr0); return 1; }

   if( g_debug > 1 )
      fprintf(stderr,"\n-d nifti_1_header diffs between '%s' and '%s'...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   if( opts->flist.len <= 0 )
      diffs = diff_hdrs(nhdr0, nhdr1, g_debug > 0);
   else
      diffs = diff_hdrs_list(nhdr0, nhdr1, &opts->flist, g_debug > 0);

   if( diffs == 0 && g_debug > 1 )
      fprintf(stderr,"+d no differences found\n");
   else if ( g_debug > 2 )
      fprintf(stderr,"+d %d differences found\n", diffs);

   free(nhdr0);
   free(nhdr1);

   return (diffs > 0);
}